

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::MultiDraw(DeviceContextVkImpl *this,MultiDrawAttribs *Attribs)

{
  Uint32 *pUVar1;
  uint32_t uVar2;
  VkMultiDrawInfoEXT *pVertexInfo;
  MultiDrawItem *pMVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::MultiDraw
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  PrepareForDraw(this,Attribs->Flags);
  if (Attribs->NumInstances != 0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NativeMultiDrawSupported == false) {
      uVar4 = Attribs->DrawCount;
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          uVar5 = Attribs->pDrawItems[uVar6].NumVertices;
          if (uVar5 != 0) {
            VulkanUtilities::VulkanCommandBuffer::Draw
                      (&this->m_CommandBuffer,uVar5,Attribs->NumInstances,
                       Attribs->pDrawItems[uVar6].StartVertexLocation,Attribs->FirstInstanceLocation
                      );
            pUVar1 = &(this->m_State).NumCommands;
            *pUVar1 = *pUVar1 + 1;
            uVar4 = Attribs->DrawCount;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar4);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace,
                 (ulong)Attribs->DrawCount << 3);
      uVar4 = Attribs->DrawCount;
      if (uVar4 != 0) {
        pVertexInfo = (VkMultiDrawInfoEXT *)
                      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        pMVar3 = Attribs->pDrawItems;
        uVar6 = 0;
        uVar5 = 0;
        do {
          uVar2 = pMVar3[uVar6].NumVertices;
          if (uVar2 != 0) {
            pVertexInfo[uVar6].firstVertex = pMVar3[uVar6].StartVertexLocation;
            pVertexInfo[uVar6].vertexCount = uVar2;
            uVar5 = uVar5 + 1;
            uVar4 = Attribs->DrawCount;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar4);
        if (uVar5 != 0) {
          VulkanUtilities::VulkanCommandBuffer::MultiDraw
                    (&this->m_CommandBuffer,uVar5,pVertexInfo,Attribs->NumInstances,
                     Attribs->FirstInstanceLocation);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MultiDraw(const MultiDrawAttribs& Attribs)
{
    TDeviceContextBase::MultiDraw(Attribs, 0);

    PrepareForDraw(Attribs.Flags);

    if (Attribs.NumInstances == 0)
        return;

    if (m_NativeMultiDrawSupported)
    {
        m_ScratchSpace.resize(sizeof(VkMultiDrawInfoEXT) * Attribs.DrawCount);
        VkMultiDrawInfoEXT* pDrawInfo = reinterpret_cast<VkMultiDrawInfoEXT*>(m_ScratchSpace.data());

        Uint32 DrawCount = 0;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawItem& Item = Attribs.pDrawItems[i];
            if (Item.NumVertices > 0)
            {
                pDrawInfo[i] = {Item.StartVertexLocation, Item.NumVertices};
                ++DrawCount;
            }
        }
        if (DrawCount > 0)
        {
            m_CommandBuffer.MultiDraw(DrawCount, pDrawInfo, Attribs.NumInstances, Attribs.FirstInstanceLocation);
        }
    }
    else
    {
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawItem& Item = Attribs.pDrawItems[i];
            if (Item.NumVertices > 0)
            {
                m_CommandBuffer.Draw(Item.NumVertices, Attribs.NumInstances, Item.StartVertexLocation, Attribs.FirstInstanceLocation);
                ++m_State.NumCommands;
            }
        }
    }
}